

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

void Curl_expire(Curl_easy *data,time_t milli,expire_id id)

{
  curl_llist *list;
  int iVar1;
  Curl_multi *pCVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  time_node *ptVar6;
  curl_llist_element *pcVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  timediff_t tVar11;
  Curl_tree *pCVar12;
  curl_llist_element *pcVar13;
  time_node *ne;
  curl_llist_element *e;
  long lVar14;
  curltime cVar15;
  curltime older;
  curltime newer;
  curltime newer_00;
  curltime i;
  
  pCVar2 = data->multi;
  if (pCVar2 != (Curl_multi *)0x0) {
    cVar15 = Curl_now();
    iVar8 = ((int)milli + (int)(milli / 1000) * -1000) * 1000;
    iVar1 = cVar15.tv_usec + iVar8;
    iVar8 = cVar15.tv_usec + -1000000 + iVar8;
    if (iVar1 < 1000000) {
      iVar8 = iVar1;
    }
    lVar14 = (ulong)(999999 < iVar1) + cVar15.tv_sec + milli / 1000;
    multi_deltimeout(data,id);
    list = &(data->state).timeoutlist;
    ne = (data->state).expires + id;
    (data->state).expires[id].time.tv_sec = lVar14;
    (data->state).expires[id].time.tv_usec = iVar8;
    (data->state).expires[id].eid = id;
    sVar10 = Curl_llist_count(list);
    if ((sVar10 == 0) || (list->head == (curl_llist_element *)0x0)) {
      e = (curl_llist_element *)0x0;
    }
    else {
      pcVar7 = list->head;
      e = (curl_llist_element *)0x0;
      do {
        pcVar13 = pcVar7;
        ptVar6 = (data->state).expires + id;
        uVar4 = (ptVar6->time).tv_sec;
        uVar5 = (ptVar6->time).tv_usec;
        cVar15.tv_usec = uVar5;
        cVar15.tv_sec = uVar4;
        cVar15._12_4_ = 0;
        newer._12_4_ = 0;
        newer._0_12_ = *(undefined1 (*) [12])((long)pcVar13->ptr + 0x18);
        tVar11 = Curl_timediff(newer,cVar15);
        if (0 < tVar11) break;
        pcVar7 = pcVar13->next;
        e = pcVar13;
      } while (pcVar13->next != (curl_llist_element *)0x0);
    }
    Curl_llist_insert_next(list,e,ne,&ne->list);
    lVar3 = (data->state).expiretime.tv_sec;
    if ((lVar3 != 0) || ((data->state).expiretime.tv_usec != 0)) {
      older.tv_usec = (data->state).expiretime.tv_usec;
      older.tv_sec = lVar3;
      older._12_4_ = 0;
      newer_00.tv_usec = iVar8;
      newer_00.tv_sec = lVar14;
      newer_00._12_4_ = 0;
      tVar11 = Curl_timediff(newer_00,older);
      if (0 < tVar11) {
        return;
      }
      uVar9 = Curl_splayremovebyaddr(pCVar2->timetree,&(data->state).timenode,&pCVar2->timetree);
      if (uVar9 != 0) {
        Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)uVar9);
      }
    }
    (data->state).expiretime.tv_sec = lVar14;
    (data->state).expiretime.tv_usec = iVar8;
    (data->state).timenode.payload = data;
    i.tv_usec = iVar8;
    i.tv_sec = lVar14;
    i._12_4_ = 0;
    pCVar12 = Curl_splayinsert(i,pCVar2->timetree,&(data->state).timenode);
    pCVar2->timetree = pCVar12;
  }
  return;
}

Assistant:

void Curl_expire(struct Curl_easy *data, time_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *nowp = &data->state.expiretime;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = Curl_now();
  set.tv_sec += milli/1000;
  set.tv_usec += (unsigned int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list.  It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(nowp->tv_sec || nowp->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *nowp);
    int rc;

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We don't need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d\n", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *nowp = set;
  data->state.timenode.payload = data;
  multi->timetree = Curl_splayinsert(*nowp, multi->timetree,
                                     &data->state.timenode);
}